

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableStringFieldGenerator::GenerateBuilderMembers
          (RepeatedImmutableStringFieldGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  FieldDescriptor *pFVar1;
  bool bVar2;
  string_view begin_varname;
  string_view begin_varname_00;
  string_view begin_varname_01;
  string_view begin_varname_02;
  string_view begin_varname_03;
  string_view begin_varname_04;
  string_view begin_varname_05;
  string_view begin_varname_06;
  string_view begin_varname_07;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  string_view end_varname_03;
  string_view end_varname_04;
  string_view end_varname_05;
  string_view end_varname_06;
  string_view end_varname_07;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  Options local_300;
  Options local_2b0;
  Options local_260;
  Options local_210;
  Options local_1c0;
  Options local_170;
  Options local_120;
  Options local_d0;
  Options local_80;
  
  vars = &(this->super_ImmutableStringFieldGenerator).variables_;
  text._M_str = "private com.google.protobuf.LazyStringArrayList $name$_ =\n    $empty_list$;\n";
  text._M_len = 0x4c;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text);
  text_00._M_str =
       "private void ensure$capitalized_name$IsMutable() {\n  if (!$name$_.isModifiable()) {\n    $name$_ = new com.google.protobuf.LazyStringArrayList($name$_);\n  }\n  $set_has_field_bit_builder$\n}\n"
  ;
  text_00._M_len = 0xbc;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_00);
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  Options::Options(&local_80,&((this->super_ImmutableStringFieldGenerator).context_)->options_);
  WriteFieldAccessorDocComment(printer,pFVar1,LIST_GETTER,&local_80,false,false,false);
  Options::~Options(&local_80);
  text_01._M_str =
       "$deprecation$public com.google.protobuf.ProtocolStringList\n    ${$get$capitalized_name$List$}$() {\n  $name$_.makeImmutable();\n  return $name$_;\n}\n"
  ;
  text_01._M_len = 0x92;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_01);
  begin_varname._M_str = "{";
  begin_varname._M_len = 1;
  end_varname._M_str = "}";
  end_varname._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname,end_varname,
             (this->super_ImmutableStringFieldGenerator).descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  Options::Options(&local_d0,&((this->super_ImmutableStringFieldGenerator).context_)->options_);
  WriteFieldAccessorDocComment(printer,pFVar1,LIST_COUNT,&local_d0,false,false,false);
  Options::~Options(&local_d0);
  text_02._M_str =
       "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n  return $name$_.size();\n}\n"
  ;
  text_02._M_len = 0x58;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_02);
  begin_varname_00._M_str = "{";
  begin_varname_00._M_len = 1;
  end_varname_00._M_str = "}";
  end_varname_00._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_00,end_varname_00,
             (this->super_ImmutableStringFieldGenerator).descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  Options::Options(&local_120,&((this->super_ImmutableStringFieldGenerator).context_)->options_);
  WriteFieldAccessorDocComment(printer,pFVar1,LIST_INDEXED_GETTER,&local_120,false,false,false);
  Options::~Options(&local_120);
  text_03._M_str =
       "$deprecation$public java.lang.String ${$get$capitalized_name$$}$(int index) {\n  return $name$_.get(index);\n}\n"
  ;
  text_03._M_len = 0x6d;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_03);
  begin_varname_01._M_str = "{";
  begin_varname_01._M_len = 1;
  end_varname_01._M_str = "}";
  end_varname_01._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_01,end_varname_01,
             (this->super_ImmutableStringFieldGenerator).descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  Options::Options(&local_170,&((this->super_ImmutableStringFieldGenerator).context_)->options_);
  WriteFieldStringBytesAccessorDocComment
            (printer,pFVar1,LIST_INDEXED_GETTER,&local_170,false,false,false);
  Options::~Options(&local_170);
  text_04._M_str =
       "$deprecation$public com.google.protobuf.ByteString\n    ${$get$capitalized_name$Bytes$}$(int index) {\n  return $name$_.getByteString(index);\n}\n"
  ;
  text_04._M_len = 0x8e;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_04);
  begin_varname_02._M_str = "{";
  begin_varname_02._M_len = 1;
  end_varname_02._M_str = "}";
  end_varname_02._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_02,end_varname_02,
             (this->super_ImmutableStringFieldGenerator).descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  Options::Options(&local_1c0,&((this->super_ImmutableStringFieldGenerator).context_)->options_);
  WriteFieldAccessorDocComment(printer,pFVar1,LIST_INDEXED_SETTER,&local_1c0,true,false,false);
  Options::~Options(&local_1c0);
  text_05._M_str =
       "$deprecation$public Builder ${$set$capitalized_name$$}$(\n    int index, java.lang.String value) {\n  $null_check$\n  ensure$capitalized_name$IsMutable();\n  $name$_.set(index, value);\n  $set_has_field_bit_builder$\n  $on_changed$\n  return this;\n}\n"
  ;
  text_05._M_len = 0xf3;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_05);
  begin_varname_03._M_str = "{";
  begin_varname_03._M_len = 1;
  end_varname_03._M_str = "}";
  end_varname_03._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_03,end_varname_03,
             (this->super_ImmutableStringFieldGenerator).descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x100000001);
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  Options::Options(&local_210,&((this->super_ImmutableStringFieldGenerator).context_)->options_);
  WriteFieldAccessorDocComment(printer,pFVar1,LIST_ADDER,&local_210,true,false,false);
  Options::~Options(&local_210);
  text_06._M_str =
       "$deprecation$public Builder ${$add$capitalized_name$$}$(\n    java.lang.String value) {\n  $null_check$\n  ensure$capitalized_name$IsMutable();\n  $name$_.add(value);\n  $set_has_field_bit_builder$\n  $on_changed$\n  return this;\n}\n"
  ;
  text_06._M_len = 0xe1;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_06);
  begin_varname_04._M_str = "{";
  begin_varname_04._M_len = 1;
  end_varname_04._M_str = "}";
  end_varname_04._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_04,end_varname_04,
             (this->super_ImmutableStringFieldGenerator).descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x100000001);
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  Options::Options(&local_260,&((this->super_ImmutableStringFieldGenerator).context_)->options_);
  WriteFieldAccessorDocComment(printer,pFVar1,LIST_MULTI_ADDER,&local_260,true,false,false);
  Options::~Options(&local_260);
  text_07._M_str =
       "$deprecation$public Builder ${$addAll$capitalized_name$$}$(\n    java.lang.Iterable<java.lang.String> values) {\n  ensure$capitalized_name$IsMutable();\n  com.google.protobuf.AbstractMessageLite.Builder.addAll(\n      values, $name$_);\n  $set_has_field_bit_builder$\n  $on_changed$\n  return this;\n}\n"
  ;
  text_07._M_len = 0x126;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_07);
  begin_varname_05._M_str = "{";
  begin_varname_05._M_len = 1;
  end_varname_05._M_str = "}";
  end_varname_05._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_05,end_varname_05,
             (this->super_ImmutableStringFieldGenerator).descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x100000001);
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  Options::Options(&local_2b0,&((this->super_ImmutableStringFieldGenerator).context_)->options_);
  WriteFieldAccessorDocComment(printer,pFVar1,CLEARER,&local_2b0,true,false,false);
  Options::~Options(&local_2b0);
  text_08._M_str =
       "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  $name$_ =\n    $empty_list$;\n  $clear_has_field_bit_builder$;\n  $on_changed$\n  return this;\n}\n"
  ;
  text_08._M_len = 0x9d;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_08);
  begin_varname_06._M_str = "{";
  begin_varname_06._M_len = 1;
  end_varname_06._M_str = "}";
  end_varname_06._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_06,end_varname_06,
             (this->super_ImmutableStringFieldGenerator).descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x100000001);
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  Options::Options(&local_300,&((this->super_ImmutableStringFieldGenerator).context_)->options_);
  WriteFieldStringBytesAccessorDocComment(printer,pFVar1,LIST_ADDER,&local_300,true,false,false);
  Options::~Options(&local_300);
  text_09._M_str =
       "$deprecation$public Builder ${$add$capitalized_name$Bytes$}$(\n    com.google.protobuf.ByteString value) {\n  $null_check$\n"
  ;
  text_09._M_len = 0x79;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_09);
  begin_varname_07._M_str = "{";
  begin_varname_07._M_len = 1;
  end_varname_07._M_str = "}";
  end_varname_07._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_07,end_varname_07,
             (this->super_ImmutableStringFieldGenerator).descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x100000001);
  bVar2 = CheckUtf8((this->super_ImmutableStringFieldGenerator).descriptor_);
  if (bVar2) {
    text_10._M_str = "  checkByteStringIsUtf8(value);\n";
    text_10._M_len = 0x20;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_10);
  }
  text_11._M_str =
       "  ensure$capitalized_name$IsMutable();\n  $name$_.add(value);\n  $set_has_field_bit_builder$\n  $on_changed$\n  return this;\n}\n"
  ;
  text_11._M_len = 0x7b;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_11);
  return;
}

Assistant:

void RepeatedImmutableStringFieldGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  // One field is the list and the bit field keeps track of whether the
  // list is immutable. If it's immutable, the invariant is that it must
  // either an instance of Collections.emptyList() or it's an ArrayList
  // wrapped in a Collections.unmodifiableList() wrapper and nobody else has
  // a reference to the underlying ArrayList. This invariant allows us to
  // share instances of lists between protocol buffers avoiding expensive
  // memory allocations. Note, immutable is a strong guarantee here -- not
  // just that the list cannot be modified via the reference but that the
  // list can never be modified.
  printer->Print(variables_,
                 "private com.google.protobuf.LazyStringArrayList $name$_ =\n"
                 "    $empty_list$;\n");

  printer->Print(
      variables_,
      "private void ensure$capitalized_name$IsMutable() {\n"
      "  if (!$name$_.isModifiable()) {\n"
      "    $name$_ = new com.google.protobuf.LazyStringArrayList($name$_);\n"
      "  }\n"
      "  $set_has_field_bit_builder$\n"
      "}\n");

  // Note:  We return an unmodifiable list because otherwise the caller
  //   could hold on to the returned list and modify it after the message
  //   has been built, thus mutating the message which is supposed to be
  //   immutable.
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_GETTER,
                               context_->options());
  printer->Print(variables_,
                 "$deprecation$public com.google.protobuf.ProtocolStringList\n"
                 "    ${$get$capitalized_name$List$}$() {\n"
                 "  $name$_.makeImmutable();\n"
                 "  return $name$_;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_COUNT,
                               context_->options());
  printer->Print(
      variables_,
      "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n"
      "  return $name$_.size();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_GETTER,
                               context_->options());
  printer->Print(variables_,
                 "$deprecation$public java.lang.String "
                 "${$get$capitalized_name$$}$(int index) {\n"
                 "  return $name$_.get(index);\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldStringBytesAccessorDocComment(
      printer, descriptor_, LIST_INDEXED_GETTER, context_->options());
  printer->Print(variables_,
                 "$deprecation$public com.google.protobuf.ByteString\n"
                 "    ${$get$capitalized_name$Bytes$}$(int index) {\n"
                 "  return $name$_.getByteString(index);\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_SETTER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder ${$set$capitalized_name$$}$(\n"
                 "    int index, java.lang.String value) {\n"
                 "  $null_check$\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  $name$_.set(index, value);\n"
                 "  $set_has_field_bit_builder$\n"
                 "  $on_changed$\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_ADDER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder ${$add$capitalized_name$$}$(\n"
                 "    java.lang.String value) {\n"
                 "  $null_check$\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  $name$_.add(value);\n"
                 "  $set_has_field_bit_builder$\n"
                 "  $on_changed$\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_MULTI_ADDER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder ${$addAll$capitalized_name$$}$(\n"
                 "    java.lang.Iterable<java.lang.String> values) {\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  com.google.protobuf.AbstractMessageLite.Builder.addAll(\n"
                 "      values, $name$_);\n"
                 "  $set_has_field_bit_builder$\n"
                 "  $on_changed$\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  $name$_ =\n"
      "    $empty_list$;\n"
      "  $clear_has_field_bit_builder$;\n"
      "  $on_changed$\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, LIST_ADDER,
                                          context_->options(),
                                          /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$add$capitalized_name$Bytes$}$(\n"
      "    com.google.protobuf.ByteString value) {\n"
      "  $null_check$\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_, "  checkByteStringIsUtf8(value);\n");
  }
  printer->Print(variables_,
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  $name$_.add(value);\n"
                 "  $set_has_field_bit_builder$\n"
                 "  $on_changed$\n"
                 "  return this;\n"
                 "}\n");
}